

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall cmCTest::cmCTest(cmCTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var3;
  mapped_type *pmVar4;
  cmCTestGenericHandler **handler;
  pointer ppcVar5;
  long lVar6;
  Part p;
  long lVar7;
  undefined1 auVar8 [16];
  string_view value;
  string_view value_00;
  initializer_list<cmCTestGenericHandler_*> __l;
  string envValue;
  allocator_type local_b9;
  string local_b8;
  cmCTestTestHandler *local_98;
  long lStack_90;
  cmCTestConfigureHandler *local_88;
  long lStack_80;
  cmCTestSubmitHandler *local_78;
  cmCTestUploadHandler *local_70;
  string local_68;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> local_48;
  
  _Var3._M_head_impl = (Private *)operator_new(0x2a50);
  Private::Private(_Var3._M_head_impl);
  (this->Impl)._M_t.super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
  _M_t.super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
  super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl = _Var3._M_head_impl;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE",&local_68);
  if (bVar2) {
    value._M_str = local_68._M_dataplus._M_p;
    value._M_len = local_68._M_string_length;
    bVar2 = cmValue::IsOff(value);
    ((this->Impl)._M_t.
     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
     super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->OutputTestOutputOnTestFailure =
         !bVar2;
  }
  local_68._M_string_length = 0;
  *local_68._M_dataplus._M_p = '\0';
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_PROGRESS_OUTPUT",&local_68);
  if (bVar2) {
    value_00._M_str = local_68._M_dataplus._M_p;
    value_00._M_len = local_68._M_string_length;
    bVar2 = cmValue::IsOff(value_00);
    _Var3._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    (_Var3._M_head_impl)->TestProgressOutput = !bVar2;
  }
  else {
    _Var3._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Start","");
  std::__cxx11::string::_M_assign((string *)&(_Var3._M_head_impl)->Parts[0].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Update","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x60));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Configure","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0xa0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Build","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0xe0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Test","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x120));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Coverage","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x160));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"MemCheck","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x1a0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Submit","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x1e0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Notes","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x220));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ExtraFiles","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x260));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Upload","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x2a0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Done","");
  std::__cxx11::string::_M_assign((string *)((long)(_Var3._M_head_impl)->Parts + 0x2e0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  lVar6 = 0x25c0;
  lVar7 = 0;
  do {
    _Var3._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    cmsys::SystemTools::LowerCase
              (&local_b8,(string *)((long)&(_Var3._M_head_impl)->RepeatCount + lVar6));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
             ::operator[](&(_Var3._M_head_impl)->PartMap,&local_b8);
    *pmVar4 = (mapped_type)lVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x40;
  } while (lVar7 != 0xc);
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  auVar8._8_4_ = (int)_Var3._M_head_impl;
  auVar8._0_8_ = _Var3._M_head_impl;
  auVar8._12_4_ = (int)((ulong)_Var3._M_head_impl >> 0x20);
  local_b8._M_dataplus._M_p = (pointer)&(_Var3._M_head_impl)->BuildHandler;
  lStack_80 = auVar8._8_8_;
  local_b8._M_string_length = lStack_80 + 0x4b0;
  local_b8.field_2._M_allocated_capacity = (size_type)&(_Var3._M_head_impl)->CoverageHandler;
  local_b8.field_2._8_8_ = lStack_80 + 0x9f8;
  local_98 = &(_Var3._M_head_impl)->TestHandler;
  lStack_90 = lStack_80 + 0x15c8;
  local_88 = &(_Var3._M_head_impl)->ConfigureHandler;
  lStack_80 = lStack_80 + 0x1830;
  local_78 = &(_Var3._M_head_impl)->SubmitHandler;
  local_70 = &(_Var3._M_head_impl)->UploadHandler;
  __l._M_len = 10;
  __l._M_array = (iterator)&local_b8;
  std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
            (&local_48,__l,&local_b9);
  for (ppcVar5 = local_48.
                 super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppcVar5 !=
      local_48.super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    (*ppcVar5)->CTest = this;
  }
  if (local_48.super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  cmSystemTools::EnableVSConsoleOutput();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmCTest::cmCTest()
  : Impl(new Private)
{
  std::string envValue;
  if (cmSystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE", envValue)) {
    this->Impl->OutputTestOutputOnTestFailure = !cmIsOff(envValue);
  }
  envValue.clear();
  if (cmSystemTools::GetEnv("CTEST_PROGRESS_OUTPUT", envValue)) {
    this->Impl->TestProgressOutput = !cmIsOff(envValue);
  }

  this->Impl->Parts[PartStart].SetName("Start");
  this->Impl->Parts[PartUpdate].SetName("Update");
  this->Impl->Parts[PartConfigure].SetName("Configure");
  this->Impl->Parts[PartBuild].SetName("Build");
  this->Impl->Parts[PartTest].SetName("Test");
  this->Impl->Parts[PartCoverage].SetName("Coverage");
  this->Impl->Parts[PartMemCheck].SetName("MemCheck");
  this->Impl->Parts[PartSubmit].SetName("Submit");
  this->Impl->Parts[PartNotes].SetName("Notes");
  this->Impl->Parts[PartExtraFiles].SetName("ExtraFiles");
  this->Impl->Parts[PartUpload].SetName("Upload");
  this->Impl->Parts[PartDone].SetName("Done");

  // Fill the part name-to-id map.
  for (Part p = PartStart; p != PartCount; p = static_cast<Part>(p + 1)) {
    this->Impl
      ->PartMap[cmSystemTools::LowerCase(this->Impl->Parts[p].GetName())] = p;
  }

  for (auto& handler : this->Impl->GetTestingHandlers()) {
    handler->SetCTestInstance(this);
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();
}